

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall runtime::VirtualMachine::Less(VirtualMachine *this)

{
  element_type *peVar1;
  VariableType VVar2;
  anon_union_8_6_52c89740_for_Variable_1 aVar3;
  undefined8 uVar4;
  Variable VVar5;
  Variable VVar6;
  
  VVar5 = popOpStack(this);
  VVar6 = popOpStack(this);
  VVar2 = VVar6.type;
  if (VVar2 == VVar5.type) {
    if (VVar2 == Float) {
      aVar3.integerValue._1_7_ = 0;
      aVar3.boolValue = VVar6.field_1.doubleValue < VVar5.field_1.doubleValue;
      uVar4 = 2;
      goto LAB_0011674f;
    }
    if (VVar2 == Integer) {
      aVar3.integerValue._1_7_ = 0;
      aVar3.boolValue = VVar6.field_1.integerValue < VVar5.field_1.integerValue;
      uVar4 = 2;
      goto LAB_0011674f;
    }
  }
  uVar4 = 0;
  aVar3.integerValue = 0;
LAB_0011674f:
  VVar5.field_1.integerValue = aVar3.integerValue;
  VVar5._0_8_ = uVar4;
  pushOpStack(this,VVar5);
  peVar1 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar1->programCounter = peVar1->programCounter + 1;
  return;
}

Assistant:

void runtime::VirtualMachine::Less() {
  Variable second = this->popOpStack();
  Variable first = this->popOpStack();

  if (!this->protectDifferentTypes(first, second)) {
    this->advance();
    return;
  }

  if (first.type == VariableType::Integer) {
    this->pushBoolean(first.integerValue < second.integerValue);

  } else if (first.type == VariableType::Float) {
    this->pushBoolean(first.doubleValue < second.doubleValue);

  } else {
    this->pushUndefined();
  }
  this->advance();
}